

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

type __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>>::
_archive_in<chrono::ChQuaternion<double>>
          (ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>> *this,ChArchiveIn *marchive)

{
  ChArchiveIn *marchive_local;
  ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>_> *this_local;
  
  ChQuaternion<double>::ArchiveIN(*(ChQuaternion<double> **)(this + 8),marchive);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveIN<Tc>::value, void >::type
        _archive_in(ChArchiveIn& marchive) {
            this->pt2Object->ArchiveIN(marchive);
        }